

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

bool __thiscall glslang::TArraySizes::isInnerSpecialization(TArraySizes *this)

{
  int iVar1;
  TIntermTyped *pTVar2;
  int local_1c;
  int d;
  TArraySizes *this_local;
  
  local_1c = 1;
  while( true ) {
    iVar1 = TSmallArrayVector::size(&this->sizes);
    if (iVar1 <= local_1c) {
      return false;
    }
    pTVar2 = TSmallArrayVector::getDimNode(&this->sizes,local_1c);
    if (pTVar2 != (TIntermTyped *)0x0) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool isInnerSpecialization() const
    {
        for (int d = 1; d < sizes.size(); ++d) {
            if (sizes.getDimNode(d) != nullptr)
                return true;
        }

        return false;
    }